

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O2

int run_test_poll_oob(void)

{
  int iVar1;
  undefined8 uVar2;
  int *piVar3;
  char *pcVar4;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,&server_handle);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_init(uVar2,&client_handle);
      if (iVar1 == 0) {
        iVar1 = uv_tcp_init(uVar2,&peer_handle);
        if (iVar1 == 0) {
          iVar1 = uv_idle_init(uVar2,&idle);
          if (iVar1 == 0) {
            iVar1 = uv_tcp_bind(&server_handle,&addr,0);
            if (iVar1 == 0) {
              iVar1 = uv_listen(&server_handle,1,connection_cb);
              if (iVar1 == 0) {
                iVar1 = uv_tcp_nodelay(&client_handle,1);
                if (iVar1 == 0) {
                  client_fd = socket(2,1,0);
                  if (client_fd < 0) {
                    pcVar4 = "client_fd >= 0";
                    uVar2 = 0xb6;
                  }
                  else {
                    piVar3 = __errno_location();
                    do {
                      *piVar3 = 0;
                      iVar1 = connect(client_fd,(sockaddr *)&addr,0x10);
                      if (iVar1 != -1) {
                        if (iVar1 == 0) {
                          iVar1 = uv_run(uVar2,0);
                          if (iVar1 == 0) {
                            if (ticks == 10) {
                              if (cli_pr_check == '\0') {
                                pcVar4 = "cli_pr_check == 1";
                                uVar2 = 0xc2;
                              }
                              else if (cli_rd_check == 2) {
                                if (srv_rd_check == '\0') {
                                  pcVar4 = "srv_rd_check == 1";
                                  uVar2 = 200;
                                }
                                else {
                                  uVar2 = uv_default_loop();
                                  uv_walk(uVar2,close_walk_cb,0);
                                  uv_run(uVar2,0);
                                  uVar2 = uv_default_loop();
                                  iVar1 = uv_loop_close(uVar2);
                                  if (iVar1 == 0) {
                                    uv_library_shutdown();
                                    return 0;
                                  }
                                  pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                                  uVar2 = 0xca;
                                }
                              }
                              else {
                                pcVar4 = "cli_rd_check == 2";
                                uVar2 = 0xc4;
                              }
                            }
                            else {
                              pcVar4 = "ticks == kMaxTicks";
                              uVar2 = 0xbf;
                            }
                          }
                          else {
                            pcVar4 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
                            uVar2 = 0xbd;
                          }
                          goto LAB_00149bf3;
                        }
                        break;
                      }
                    } while (*piVar3 == 4);
                    pcVar4 = "r == 0";
                    uVar2 = 0xbb;
                  }
                }
                else {
                  pcVar4 = "0 == uv_tcp_nodelay(&client_handle, 1)";
                  uVar2 = 0xb3;
                }
              }
              else {
                pcVar4 = "0 == uv_listen((uv_stream_t*) &server_handle, 1, connection_cb)";
                uVar2 = 0xb0;
              }
            }
            else {
              pcVar4 = "0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0)";
              uVar2 = 0xaf;
            }
          }
          else {
            pcVar4 = "0 == uv_idle_init(loop, &idle)";
            uVar2 = 0xae;
          }
        }
        else {
          pcVar4 = "0 == uv_tcp_init(loop, &peer_handle)";
          uVar2 = 0xad;
        }
      }
      else {
        pcVar4 = "0 == uv_tcp_init(loop, &client_handle)";
        uVar2 = 0xac;
      }
    }
    else {
      pcVar4 = "0 == uv_tcp_init(loop, &server_handle)";
      uVar2 = 0xab;
    }
  }
  else {
    pcVar4 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar2 = 0xa8;
  }
LAB_00149bf3:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll-oob.c"
          ,uVar2,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(poll_oob) {
  struct sockaddr_in addr;
  int r = 0;
  uv_loop_t* loop;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  ASSERT(0 == uv_tcp_init(loop, &server_handle));
  ASSERT(0 == uv_tcp_init(loop, &client_handle));
  ASSERT(0 == uv_tcp_init(loop, &peer_handle));
  ASSERT(0 == uv_idle_init(loop, &idle));
  ASSERT(0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &server_handle, 1, connection_cb));

  /* Ensure two separate packets */
  ASSERT(0 == uv_tcp_nodelay(&client_handle, 1));

  client_fd = socket(PF_INET, SOCK_STREAM, 0);
  ASSERT(client_fd >= 0);
  do {
    errno = 0;
    r = connect(client_fd, (const struct sockaddr*)&addr, sizeof(addr));
  } while (r == -1 && errno == EINTR);
  ASSERT(r == 0);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(ticks == kMaxTicks);

  /* Did client receive the POLLPRI message */
  ASSERT(cli_pr_check == 1);
  /* Did client receive the POLLIN message */
  ASSERT(cli_rd_check == 2);
  /* Could we write with POLLOUT and did the server receive our POLLOUT message
   * through POLLIN.
   */
  ASSERT(srv_rd_check == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}